

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::UnknownField::InternalSerializeLengthDelimitedNoTag
          (UnknownField *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  pointer data;
  ulong uVar1;
  Nonnull<const_char_*> pcVar2;
  uint8_t *puVar3;
  ulong uVar4;
  uint size;
  byte *ptr;
  uint uVar5;
  
  if ((ulong)this->type_ == 3) {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (3,(ulong)this->type_,"TYPE_LENGTH_DELIMITED == type()");
  }
  if (pcVar2 != (Nonnull<const_char_*>)0x0) {
    InternalSerializeLengthDelimitedNoTag();
  }
  data = (((this->data_).string_value)->_M_dataplus)._M_p;
  uVar1 = ((this->data_).string_value)->_M_string_length;
  size = (uint)uVar1;
  if (size < 0x80) {
    uVar4 = uVar1 & 0xffffffff;
  }
  else {
    uVar4 = uVar1 & 0xffffffff;
    do {
      uVar5 = (uint)uVar4;
      *target = (byte)uVar4 | 0x80;
      uVar4 = uVar4 >> 7;
      target = target + 1;
    } while (0x3fff < uVar5);
  }
  *target = (byte)uVar4;
  ptr = target + 1;
  if ((long)stream->end_ - (long)ptr < (long)(int)size) {
    puVar3 = io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,ptr);
    return puVar3;
  }
  memcpy(ptr,data,uVar1 & 0xffffffff);
  return ptr + (int)size;
}

Assistant:

uint8_t* UnknownField::InternalSerializeLengthDelimitedNoTag(
    uint8_t* target, io::EpsCopyOutputStream* stream) const {
  ABSL_DCHECK_EQ(TYPE_LENGTH_DELIMITED, type());
  const absl::string_view data = *data_.string_value;
  target = io::CodedOutputStream::WriteVarint32ToArray(data.size(), target);
  target = stream->WriteRaw(data.data(), data.size(), target);
  return target;
}